

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O3

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (long __result,long __a,long __b,long __c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  
  uVar1 = *(uint *)(__a + 8);
  uVar2 = *(uint *)(__b + 8);
  uVar3 = *(uint *)(__c + 8);
  if (uVar2 <= uVar1) {
    if (uVar1 < uVar3) {
      uVar4 = *(undefined4 *)(__result + 8);
      *(uint *)(__result + 8) = uVar1;
      *(undefined4 *)(__a + 8) = uVar4;
      return;
    }
    uVar4 = *(undefined4 *)(__result + 8);
    if (uVar2 < uVar3) {
      *(uint *)(__result + 8) = uVar3;
      *(undefined4 *)(__c + 8) = uVar4;
      return;
    }
    *(uint *)(__result + 8) = uVar2;
    *(undefined4 *)(__b + 8) = uVar4;
    return;
  }
  if (uVar2 < uVar3) {
    uVar4 = *(undefined4 *)(__result + 8);
    *(uint *)(__result + 8) = uVar2;
    *(undefined4 *)(__b + 8) = uVar4;
    return;
  }
  uVar4 = *(undefined4 *)(__result + 8);
  if (uVar1 < uVar3) {
    *(uint *)(__result + 8) = uVar3;
    *(undefined4 *)(__c + 8) = uVar4;
    return;
  }
  *(uint *)(__result + 8) = uVar1;
  *(undefined4 *)(__a + 8) = uVar4;
  return;
}

Assistant:

bool operator<(const VarId& other) const { return id < other.id; }